

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRasterizationTests.cpp
# Opt level: O3

TestInstance * __thiscall
vkt::rasterization::anon_unknown_0::LineInterpolationTestCase::createInstance
          (LineInterpolationTestCase *this,Context *context)

{
  ostringstream *this_00;
  VkPrimitiveTopology VVar1;
  int iVar2;
  PrimitiveWideness PVar3;
  byte bVar4;
  BaseRenderingTestInstance *this_01;
  VkPhysicalDeviceProperties *pVVar5;
  VkPhysicalDeviceFeatures *pVVar6;
  float *pfVar7;
  NotSupportedError *pNVar8;
  iterator iVar9;
  VkFormat *this_02;
  float *__args;
  float fVar10;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  this_01 = (BaseRenderingTestInstance *)operator_new(0x2c0);
  VVar1 = this->m_primitiveTopology;
  iVar2 = this->m_flags;
  PVar3 = this->m_wideness;
  BaseRenderingTestInstance::BaseRenderingTestInstance
            (this_01,context,(this->super_BaseRenderingTestCase).m_sampleCount,0x100);
  (this_01->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__LineInterpolationTestInstance_00d01758;
  *(VkPrimitiveTopology *)&this_01[1].super_TestInstance._vptr_TestInstance = VVar1;
  bVar4 = (byte)iVar2;
  *(byte *)((long)&this_01[1].super_TestInstance._vptr_TestInstance + 4) = bVar4 >> 1 & 1;
  *(undefined4 *)&this_01[1].super_TestInstance.m_context = 3;
  *(PrimitiveWideness *)((long)&this_01[1].super_TestInstance.m_context + 4) = PVar3;
  this_01[1].m_renderSize = 0;
  *(undefined1 *)&this_01[1].m_sampleCount = VK_SAMPLE_COUNT_1_BIT;
  this_01[1].m_subpixelBits = 0x3f800000;
  this_02 = &this_01[1].m_imageFormat;
  this_01[1].m_imageFormat = VK_FORMAT_UNDEFINED;
  this_01[1].m_textureFormat.order = R;
  *(undefined8 *)&this_01[1].m_textureFormat.type = 0;
  this_01[1].m_commandPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal =
       0;
  *(byte *)&this_01[1].m_commandPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
            m_deviceIface = bVar4 >> 2 & 1;
  pVVar5 = Context::getDeviceProperties(context);
  if ((pVVar5->limits).strictLines == 0) {
    pNVar8 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar8,"Strict rasterization is not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
               ,0xa1c);
LAB_007a244a:
    __cxa_throw(pNVar8,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  iVar2 = *(int *)((long)&this_01[1].super_TestInstance.m_context + 4);
  if (iVar2 == 1) {
    pVVar6 = Context::getDeviceFeatures((this_01->super_TestInstance).m_context);
    if (pVVar6->wideLines == 0) {
      pNVar8 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar8,"wide line support required",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
                 ,0xa26);
      goto LAB_007a244a;
    }
    pVVar5 = Context::getDeviceProperties(context);
    local_1b0._0_8_ = ((this_01->super_TestInstance).m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"ALIASED_LINE_WIDTH_RANGE = [",0x1c);
    std::ostream::_M_insert<double>((double)(pVVar5->limits).lineWidthRange[0]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    std::ostream::_M_insert<double>((double)(pVVar5->limits).lineWidthRange[1]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"]",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    __args = (pVVar5->limits).lineWidthRange + 1;
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_138);
    if (*__args <= 1.0) {
      pNVar8 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_1b0._0_8_ = local_1b0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b0,"wide line support required","");
      tcu::NotSupportedError::NotSupportedError(pNVar8,(string *)local_1b0);
      __cxa_throw(pNVar8,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    local_1b0._0_4_ = 5.0;
    iVar9._M_current = *(float **)&this_01[1].m_textureFormat.type;
    pfVar7 = (float *)this_01[1].m_commandPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data
                      .object.m_internal;
    if (iVar9._M_current == pfVar7) {
      std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                ((vector<float,_std::allocator<float>_> *)this_02,iVar9,(float *)local_1b0);
      iVar9._M_current = *(float **)&this_01[1].m_textureFormat.type;
      pfVar7 = (float *)this_01[1].m_commandPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.
                        m_data.object.m_internal;
    }
    else {
      *iVar9._M_current = 5.0;
      iVar9._M_current = iVar9._M_current + 1;
      *(float **)&this_01[1].m_textureFormat.type = iVar9._M_current;
    }
    local_1b0._0_4_ = 0x41200000;
    if (iVar9._M_current == pfVar7) {
      std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                ((vector<float,_std::allocator<float>_> *)this_02,iVar9,(float *)local_1b0);
      iVar9._M_current = *(float **)&this_01[1].m_textureFormat.type;
      pfVar7 = (float *)this_01[1].m_commandPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.
                        m_data.object.m_internal;
    }
    else {
      *iVar9._M_current = 10.0;
      iVar9._M_current = iVar9._M_current + 1;
      *(float **)&this_01[1].m_textureFormat.type = iVar9._M_current;
    }
    if (iVar9._M_current == pfVar7) {
      std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                ((vector<float,std::allocator<float>> *)this_02,iVar9,__args);
      fVar10 = *__args;
    }
    else {
      fVar10 = *__args;
      *iVar9._M_current = fVar10;
      *(float **)&this_01[1].m_textureFormat.type = iVar9._M_current + 1;
    }
    this_01[1].m_subpixelBits = (deUint32)fVar10;
  }
  else if (iVar2 == 0) {
    local_1b0._0_4_ = 0x3f800000;
    std::vector<float,_std::allocator<float>_>::resize
              ((vector<float,_std::allocator<float>_> *)this_02,
               (long)*(int *)&this_01[1].super_TestInstance.m_context,
               (value_type_conflict2 *)local_1b0);
  }
  return &this_01->super_TestInstance;
}

Assistant:

virtual TestInstance*		createInstance					(Context& context) const
								{
									return new LineInterpolationTestInstance(context, m_primitiveTopology, m_flags, m_wideness, m_sampleCount);
								}